

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O2

void __thiscall cfd::core::Block::Block(Block *this,ByteData *data)

{
  uint32_t uVar1;
  int iVar2;
  uint64_t uVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  initializer_list<unsigned_int> __l;
  allocator_type local_119;
  ByteData txs;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> arr;
  uint local_d0;
  int local_cc;
  Deserializer dec;
  Transaction tx;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  ByteData tx_data;
  
  this->_vptr_Block = (_func_int **)&PTR__Block_00657200;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->data_,&data->data_);
  BlockHeader::BlockHeader(&this->header_);
  (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->txs_).super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txs_).super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txs_).super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  Deserializer::Deserializer(&dec,data);
  uVar1 = Deserializer::ReadUint32(&dec);
  (this->header_).version = uVar1;
  Deserializer::ReadBuffer(&txs.data_,&dec,0x20);
  ByteData256::ByteData256((ByteData256 *)&arr,&txs.data_);
  BlockHash::BlockHash((BlockHash *)&tx,(ByteData256 *)&arr);
  BlockHash::operator=(&(this->header_).prev_block_hash,(BlockHash *)&tx);
  BlockHash::~BlockHash((BlockHash *)&tx);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&arr);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txs);
  Deserializer::ReadBuffer(&txs.data_,&dec,0x20);
  ByteData256::ByteData256((ByteData256 *)&arr,&txs.data_);
  BlockHash::BlockHash((BlockHash *)&tx,(ByteData256 *)&arr);
  BlockHash::operator=(&(this->header_).merkle_root_hash,(BlockHash *)&tx);
  BlockHash::~BlockHash((BlockHash *)&tx);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&arr);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txs);
  uVar1 = Deserializer::ReadUint32(&dec);
  (this->header_).time = uVar1;
  uVar1 = Deserializer::ReadUint32(&dec);
  (this->header_).bits = uVar1;
  uVar1 = Deserializer::ReadUint32(&dec);
  (this->header_).nonce = uVar1;
  uVar3 = Deserializer::ReadVariableInt(&dec);
  sVar4 = ByteData::GetDataSize(data);
  uVar1 = Deserializer::GetReadSize(&dec);
  Deserializer::ReadBuffer
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx,&dec,(int)sVar4 - uVar1);
  ByteData::ByteData(&txs,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tx);
  while (bVar6 = uVar3 != 0, uVar3 = uVar3 - 1, bVar6) {
    Transaction::Transaction(&tx,&txs);
    AbstractTransaction::GetData(&tx_data,&tx.super_AbstractTransaction);
    sVar4 = ByteData::GetDataSize(&tx_data);
    sVar5 = ByteData::GetDataSize(&txs);
    iVar2 = (int)sVar5 - (uint)sVar4;
    if (iVar2 != 0) {
      __l._M_len = 2;
      __l._M_array = &local_d0;
      local_d0 = (uint)sVar4;
      local_cc = iVar2;
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,__l,&local_119);
      ByteData::SplitData(&arr,&txs,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60
                         );
      ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&txs,
                 &arr.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_start[1].data_);
      ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&arr);
    }
    ::std::vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>>::
    emplace_back<cfd::core::ByteData&>
              ((vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>> *)&this->txs_,
               &tx_data);
    AbstractTransaction::GetTxid((Txid *)&arr,&tx.super_AbstractTransaction);
    ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::emplace_back<cfd::core::Txid>
              (&this->txids_,(Txid *)&arr);
    Txid::~Txid((Txid *)&arr);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tx_data);
    Transaction::~Transaction(&tx);
  }
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txs);
  Deserializer::~Deserializer(&dec);
  return;
}

Assistant:

Block::Block(const ByteData& data) : data_(data) {
  Deserializer dec(data);
  header_.version = dec.ReadUint32();
  header_.prev_block_hash = BlockHash(dec.ReadBuffer(32));
  header_.merkle_root_hash = BlockHash(dec.ReadBuffer(32));
  header_.time = dec.ReadUint32();
  header_.bits = dec.ReadUint32();
  header_.nonce = dec.ReadUint32();
  uint64_t tx_count = dec.ReadVariableInt();
  size_t read_size = data.GetDataSize() - dec.GetReadSize();
  auto txs = ByteData(dec.ReadBuffer(static_cast<uint32_t>(read_size)));
  for (uint64_t index = 0; index < tx_count; ++index) {
    Transaction tx(txs);
    auto tx_data = tx.GetData();
    uint32_t cur_size = static_cast<uint32_t>(tx_data.GetDataSize());
    uint32_t unread_size = static_cast<uint32_t>(txs.GetDataSize()) - cur_size;
    if (unread_size != 0) {
      auto arr = txs.SplitData(std::vector<uint32_t>{cur_size, unread_size});
      txs = arr[1];
    }
    txs_.emplace_back(tx_data);
    txids_.emplace_back(tx.GetTxid());
  }
}